

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O0

void __thiscall Fossilize::StreamArchive::~StreamArchive(StreamArchive *this)

{
  unordered_map<unsigned_long,_Fossilize::StreamArchive::Entry,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>_>_>
  *local_20;
  StreamArchive *this_local;
  
  (this->super_DatabaseInterface)._vptr_DatabaseInterface =
       (_func_int **)&PTR__StreamArchive_00208b20;
  free(this->zlib_buffer);
  if (this->file != (FILE *)0x0) {
    fclose((FILE *)this->file);
  }
  local_20 = (unordered_map<unsigned_long,_Fossilize::StreamArchive::Entry,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>_>_>
              *)&this->mode;
  do {
    local_20 = local_20 + -1;
    std::
    unordered_map<unsigned_long,_Fossilize::StreamArchive::Entry,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>_>_>
    ::~unordered_map(local_20);
  } while (local_20 != this->seen_blobs);
  std::__cxx11::string::~string((string *)&this->path);
  DatabaseInterface::~DatabaseInterface(&this->super_DatabaseInterface);
  return;
}

Assistant:

~StreamArchive()
	{
		free(zlib_buffer);
		if (file)
			fclose(file);
	}